

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

int __thiscall ON_PolyEdgeCurve::FindCurve(ON_PolyEdgeCurve *this,ON_Curve *curve)

{
  int iVar1;
  int iVar2;
  ON_PolyEdgeSegment *this_00;
  ON_Curve *pOVar3;
  int iVar4;
  int segment_index;
  bool bVar5;
  
  iVar4 = -1;
  if ((curve != (ON_Curve *)0x0) &&
     (iVar2 = ON_PolyCurve::Count(&this->super_ON_PolyCurve), 0 < iVar2)) {
    iVar4 = -1;
    segment_index = 0;
    do {
      this_00 = SegmentCurve(this,segment_index);
      if ((this_00 == (ON_PolyEdgeSegment *)0x0) ||
         (((bVar5 = true, iVar1 = segment_index, this_00 != (ON_PolyEdgeSegment *)curve &&
           (pOVar3 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy), pOVar3 != curve)) &&
          (this_00->m_edge != (ON_BrepEdge *)curve)))) {
        bVar5 = false;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
    } while ((!bVar5) &&
            (bVar5 = iVar2 + -1 != segment_index, segment_index = segment_index + 1, bVar5));
  }
  return iVar4;
}

Assistant:

int ON_PolyEdgeCurve::FindCurve( const ON_Curve* curve) const
{
  int rc = -1;
  if ( 0 != curve )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if (    0 != segment 
           && (curve == segment || curve == segment->ProxyCurve() || curve == segment->BrepEdge()) )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}